

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_comment.cpp
# Opt level: O0

void __thiscall Comment_BashMultipleLeading_Test::TestBody(Comment_BashMultipleLeading_Test *this)

{
  bool bVar1;
  MockSpec<std::error_code_()> *this_00;
  TypedExpectation<std::error_code_()> *this_01;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_02;
  Message *pMVar2;
  error_code *this_03;
  char *message;
  extensions extensions;
  mock_json_callbacks *in_RSI;
  char *in_R9;
  string local_160;
  AssertHelper local_140;
  string local_138;
  Message local_118;
  bool local_109;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  undefined1 local_c8 [8];
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  MockSpec<std::error_code_()> local_20;
  Comment_BashMultipleLeading_Test *local_10;
  Comment_BashMultipleLeading_Test *this_local;
  
  local_10 = this;
  local_20.function_mocker_ =
       (FunctionMocker<std::error_code_()> *)
       mock_json_callbacks::gmock_null_value
                 ((MockSpec<std::error_code_()> *)&(this->super_Comment).callbacks_,in_RSI);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<std::error_code_()>::operator()
                      (&local_20,(WithoutMatchers *)((long)&p.coordinate_.row + 3),(void *)0x0);
  extensions = 0x1effd7;
  this_01 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
                       ,0x34,"callbacks_","null_value ()");
  testing::internal::TypedExpectation<std::error_code_()>::Times(this_01,1);
  pstore::json::make_parser<callbacks_proxy<mock_json_callbacks>>
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_c8,
             (json *)&(this->super_Comment).proxy_,(callbacks_proxy<mock_json_callbacks> *)0x1,
             extensions);
  s_abi_cxx11_(&local_e8,"# comment\n\n    # remark\nnull",0x1c);
  this_02 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input
                      ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_c8,&local_e8);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_02);
  std::__cxx11::string::~string((string *)&local_e8);
  local_109 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::has_error
                        ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_c8);
  local_109 = !local_109;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_108,&local_109,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pMVar2 = testing::Message::operator<<(&local_118,(char (*) [17])"JSON error was: ");
    this_03 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::last_error
                        ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_c8);
    std::error_code::message_abi_cxx11_(&local_138,this_03);
    pMVar2 = testing::Message::operator<<(pMVar2,&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_160,(internal *)local_108,(AssertionResult *)"p.has_error ()","true","false",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_comment.cpp"
               ,0x38,message);
    testing::internal::AssertHelper::operator=(&local_140,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_138);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_c8);
  return;
}

Assistant:

TEST_F (Comment, BashMultipleLeading) {
    EXPECT_CALL (callbacks_, null_value ()).Times (1);

    json::parser<decltype (proxy_)> p = json::make_parser (proxy_, json::extensions::bash_comments);
    p.input ("# comment\n\n    # remark\nnull"s).eof ();
    EXPECT_FALSE (p.has_error ()) << "JSON error was: " << p.last_error ().message ();
}